

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O3

GlContext *
sf::priv::GlContext::create(ContextSettings *settings,WindowImpl *owner,uint bitsPerPixel)

{
  GlxContext *pGVar1;
  Lock lock;
  Lock LStack_48;
  ContextSettings local_3c;
  
  Lock::Lock(&LStack_48,(Mutex *)&(anonymous_namespace)::GlContextImpl::mutex);
  if ((((anonymous_namespace)::GlContextImpl::resourceCount == 1) &&
      ((settings->attributeFlags & 1) != 0)) &&
     ((((anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext).m_settings.
       attributeFlags & 1) == 0)) {
    local_3c.depthBits = 0;
    local_3c.stencilBits = 0;
    local_3c.antialiasingLevel = 0;
    local_3c.majorVersion = settings->majorVersion;
    local_3c.minorVersion = settings->minorVersion;
    local_3c.sRgbCapable = false;
    local_3c.attributeFlags = settings->attributeFlags;
    (*((anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext)._vptr_GlContext[1])();
    pGVar1 = (GlxContext *)operator_new(0x58);
    GlxContext::GlxContext(pGVar1,(GlxContext *)0x0,&local_3c,1,1);
    (anonymous_namespace)::GlContextImpl::sharedContext = pGVar1;
    initialize((GlContext *)pGVar1,&local_3c);
    anon_unknown.dwarf_2b48f9::GlContextImpl::loadExtensions();
  }
  setActive(&(anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext,true);
  pGVar1 = (GlxContext *)operator_new(0x58);
  GlxContext::GlxContext
            (pGVar1,(anonymous_namespace)::GlContextImpl::sharedContext,settings,owner,bitsPerPixel)
  ;
  setActive(&(anonymous_namespace)::GlContextImpl::sharedContext->super_GlContext,false);
  initialize((GlContext *)pGVar1,settings);
  checkSettings((GlContext *)pGVar1,settings);
  Lock::~Lock(&LStack_48);
  return &pGVar1->super_GlContext;
}

Assistant:

GlContext* GlContext::create(const ContextSettings& settings, const WindowImpl* owner, unsigned int bitsPerPixel)
{
    using GlContextImpl::mutex;
    using GlContextImpl::resourceCount;
    using GlContextImpl::sharedContext;
    using GlContextImpl::loadExtensions;

    // Make sure that there's an active context (context creation may need extensions, and thus a valid context)
    assert(sharedContext != NULL);

    Lock lock(mutex);

    // If resourceCount is 1 we know that we are inside sf::Context or sf::Window
    // Only in this situation we allow the user to indirectly re-create the shared context as a core context

    // Check if we need to convert our shared context into a core context
    if ((resourceCount == 1) &&
        (settings.attributeFlags & ContextSettings::Core) &&
        !(sharedContext->m_settings.attributeFlags & ContextSettings::Core))
    {
        // Re-create our shared context as a core context
        ContextSettings sharedSettings(0, 0, 0, settings.majorVersion, settings.minorVersion, settings.attributeFlags);

        delete sharedContext;
        sharedContext = new ContextType(NULL, sharedSettings, 1, 1);
        sharedContext->initialize(sharedSettings);

        // Reload our extensions vector
        loadExtensions();
    }

    GlContext* context = NULL;

    // We don't use acquireTransientContext here since we have
    // to ensure we have exclusive access to the shared context
    // in order to make sure it is not active during context creation
    {
        sharedContext->setActive(true);

        // Create the context
        context = new ContextType(sharedContext, settings, owner, bitsPerPixel);

        sharedContext->setActive(false);
    }

    context->initialize(settings);
    context->checkSettings(settings);

    return context;
}